

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManIncrSimUpdate(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  int iVar1;
  int iVar2;
  word *pwVar3;
  word wVar4;
  word *pSims;
  int k;
  int i;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(p->vTimeStamps);
  iVar2 = Gia_ManObjNum(p);
  if (iVar2 < iVar1) {
    __assert_fail("Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x46f,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  p_00 = p->vTimeStamps;
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFillExtra(p_00,iVar1,0);
  iVar1 = Vec_WrdSize(p->vSims);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 <= iVar2 * p->nSimWords) {
    p_01 = p->vSims;
    iVar1 = Gia_ManObjNum(p);
    Vec_WrdFillExtra(p_01,iVar1 * p->nSimWords,0);
    iVar1 = p->iNextPi;
    iVar2 = Gia_ManCiNum(p);
    if (iVar1 <= iVar2) {
      pSims._4_4_ = p->iNextPi;
      while( true ) {
        iVar1 = Gia_ManCiNum(p);
        if (iVar1 <= pSims._4_4_) break;
        iVar1 = Gia_ManCiIdToId(p,pSims._4_4_);
        pwVar3 = Gia_ManBuiltInData(p,iVar1);
        for (pSims._0_4_ = 0; (int)pSims < p->nSimWords; pSims._0_4_ = (int)pSims + 1) {
          wVar4 = Gia_ManRandomW(0);
          pwVar3[(int)pSims] = wVar4;
        }
        pSims._4_4_ = pSims._4_4_ + 1;
      }
      iVar1 = Gia_ManCiNum(p);
      p->iNextPi = iVar1;
      return;
    }
    __assert_fail("p->iNextPi <= Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x475,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  __assert_fail("Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                ,0x472,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
}

Assistant:

void Gia_ManIncrSimUpdate( Gia_Man_t * p )
{
    int i, k;
    // extend timestamp info
    assert( Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p) );
    Vec_IntFillExtra( p->vTimeStamps, Gia_ManObjNum(p), 0 );
    // extend simulation info
    assert( Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords );
    Vec_WrdFillExtra( p->vSims,  Gia_ManObjNum(p) * p->nSimWords,  0 );
    // extend PI info
    assert( p->iNextPi <= Gia_ManCiNum(p) );
    for ( i = p->iNextPi; i < Gia_ManCiNum(p); i++ )
    {
        word * pSims = Gia_ManBuiltInData( p, Gia_ManCiIdToId(p, i) );
        for ( k = 0; k < p->nSimWords; k++ )
            pSims[k] = Gia_ManRandomW(0);
    }
    p->iNextPi = Gia_ManCiNum(p);
}